

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O2

ref<aphy::collision_mesh_collection>
aphy::
makeObjectWithInterface<aphy::collision_mesh_collection,APhyBullet::APhyBulletCollisionMeshCollection>
          (void)

{
  pointer __p;
  APhyBulletCollisionMeshCollection *this;
  aphy_icd_dispatch *paVar1;
  Counter *in_RDI;
  __uniq_ptr_impl<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
  local_18;
  
  this = (APhyBulletCollisionMeshCollection *)::operator_new(0x100);
  APhyBullet::APhyBulletCollisionMeshCollection::APhyBulletCollisionMeshCollection(this);
  paVar1 = (aphy_icd_dispatch *)::operator_new(0x18);
  *(undefined1 **)paVar1 = cppRefcountedDispatchTable;
  paVar1->aphyGetEngines = (aphyGetEngines_FUN)this;
  paVar1->aphyAddEngineReference = (aphyAddEngineReference_FUN)0x1;
  (this->super_collision_mesh_collection).super_base_interface.myRefCounter = paVar1;
  local_18._M_t.
  super__Tuple_impl<0UL,_aphy::ref_counter<aphy::collision_mesh_collection>_*,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
  .super__Head_base<0UL,_aphy::ref_counter<aphy::collision_mesh_collection>_*,_false>._M_head_impl =
       (tuple<aphy::ref_counter<aphy::collision_mesh_collection>_*,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
        )(_Tuple_impl<0UL,_aphy::ref_counter<aphy::collision_mesh_collection>_*,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
          )0x0;
  in_RDI->dispatchTable = paVar1;
  std::
  unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::collision_mesh_collection>,_std::default_delete<aphy::ref_counter<aphy::collision_mesh_collection>_>_>
                 *)&local_18);
  return (ref<aphy::collision_mesh_collection>)in_RDI;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}